

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void re2c::output_state_goto(ostream *o,uint32_t ind,uint32_t start_label)

{
  ostream *poVar1;
  opt_t *poVar2;
  uint32_t ind_00;
  uint32_t ind_01;
  uint32_t extraout_EDX;
  uint32_t ind_02;
  uint32_t extraout_EDX_00;
  undefined4 in_register_00000034;
  uint32_t i;
  ulong uVar3;
  string local_70;
  string local_50 [32];
  
  indent_abi_cxx11_(&local_70,(re2c *)CONCAT44(in_register_00000034,ind),start_label);
  poVar1 = std::operator<<(o,(string *)&local_70);
  poVar1 = std::operator<<(poVar1,"switch (");
  output_get_state_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_50);
  std::operator<<(poVar1,") {\n");
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar2->bUseStateAbort == true) {
    indent_abi_cxx11_(&local_70,(re2c *)(ulong)ind,ind_00);
    poVar1 = std::operator<<(o,(string *)&local_70);
    std::operator<<(poVar1,"default: abort();\n");
    std::__cxx11::string::~string((string *)&local_70);
    indent_abi_cxx11_(&local_70,(re2c *)(ulong)ind,ind_01);
    poVar1 = std::operator<<(o,(string *)&local_70);
    poVar1 = std::operator<<(poVar1,"case -1: goto ");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->labelPrefix);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,";\n");
  }
  else {
    indent_abi_cxx11_(&local_70,(re2c *)(ulong)ind,ind_00);
    poVar1 = std::operator<<(o,(string *)&local_70);
    poVar1 = std::operator<<(poVar1,"default: goto ");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->labelPrefix);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,";\n");
  }
  std::__cxx11::string::~string((string *)&local_70);
  ind_02 = extraout_EDX;
  for (uVar3 = 0; uVar3 < last_fill_index; uVar3 = uVar3 + 1) {
    indent_abi_cxx11_(&local_70,(re2c *)(ulong)ind,ind_02);
    poVar1 = std::operator<<(o,(string *)&local_70);
    poVar1 = std::operator<<(poVar1,"case ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,": goto ");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yyfilllabel);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,";\n");
    std::__cxx11::string::~string((string *)&local_70);
    ind_02 = extraout_EDX_00;
  }
  indent_abi_cxx11_(&local_70,(re2c *)(ulong)ind,ind_02);
  poVar1 = std::operator<<(o,(string *)&local_70);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar2->bUseStateNext == true) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(o,(string *)&poVar2->yynext);
    std::operator<<(poVar1,":\n");
  }
  return;
}

Assistant:

void output_state_goto (std::ostream & o, uint32_t ind, uint32_t start_label)
{
	o << indent(ind) << "switch (" << output_get_state() << ") {\n";
	if (opts->bUseStateAbort)
	{
		o << indent(ind) << "default: abort();\n";
		o << indent(ind) << "case -1: goto " << opts->labelPrefix << start_label << ";\n";
	}
	else
	{
		o << indent(ind) << "default: goto " << opts->labelPrefix << start_label << ";\n";
	}
	for (uint32_t i = 0; i < last_fill_index; ++i)
	{
		o << indent(ind) << "case " << i << ": goto " << opts->yyfilllabel << i << ";\n";
	}
	o << indent(ind) << "}\n";
	if (opts->bUseStateNext)
	{
		o << opts->yynext << ":\n";
	}
}